

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall
Js::FunctionExecutionStateMachine::ReinitializeExecutionModeAndLimits
          (FunctionExecutionStateMachine *this,FunctionBody *functionBody)

{
  DebuggerMode DVar1;
  
  this->hasBeenReinitialized = true;
  DVar1 = FunctionBody::GetDebuggerMode(functionBody);
  this->reinitDebuggerMode = DVar1;
  this->fullJitRequeueThreshold = 0;
  this->committedProfiledIterations = 0;
  InitializeExecutionModeAndLimits(this,functionBody);
  return;
}

Assistant:

void FunctionExecutionStateMachine::ReinitializeExecutionModeAndLimits(FunctionBody* functionBody)
    {
#if DBG
        hasBeenReinitialized = true;
#ifdef ENABLE_SCRIPT_DEBUGGING
        reinitDebuggerMode = functionBody->GetDebuggerMode();
#endif
#endif
        // TODO: Investigate what it would take to make this invariant hold. Currently fails in AsmJS tests
        // Assert(initializedExecutionModeAndLimits);

        fullJitRequeueThreshold = 0;
        committedProfiledIterations = 0;
        InitializeExecutionModeAndLimits(functionBody);
    }